

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O0

void __thiscall
gimage::Histogram::Histogram<unsigned_short>
          (Histogram *this,Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image1,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image2,int binsize)

{
  bool bVar1;
  store_t_conflict1 sVar2;
  store_t_conflict1 sVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  int in_ECX;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RDX;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RSI;
  int *in_RDI;
  unsigned_short v2;
  unsigned_short v1;
  int d;
  int i;
  int k;
  int height;
  int width;
  Histogram *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  uint in_stack_ffffffffffffff74;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_ffffffffffffff78;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_stack_ffffffffffffff80;
  int local_48;
  int local_44;
  int local_40;
  work_t local_3c;
  int local_38 [3];
  work_t local_2c;
  int local_28 [3];
  int local_1c;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_18;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_10;
  
  in_RDI[2] = 0;
  in_RDI[1] = 0;
  *in_RDI = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  local_28[1] = 0x100;
  local_28[0] = 0x10000;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_2c = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::maxValue
                       (in_stack_ffffffffffffff80);
  piVar5 = std::min<int>(local_28,&local_2c);
  piVar5 = std::max<int>(local_28 + 1,piVar5);
  local_28[2] = *piVar5 / local_1c;
  local_38[1] = 0x100;
  local_38[0] = 0x10000;
  local_3c = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::maxValue
                       (in_stack_ffffffffffffff80);
  piVar5 = std::min<int>(local_38,&local_3c);
  piVar5 = std::max<int>(local_38 + 1,piVar5);
  local_38[2] = *piVar5 / local_1c;
  setSize((Histogram *)in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
          (int)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  clear(in_stack_ffffffffffffff60);
  local_40 = 0;
  while( true ) {
    lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(local_10);
    bVar1 = false;
    if (local_40 < lVar6) {
      lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(local_18);
      bVar1 = local_40 < lVar6;
    }
    if (!bVar1) break;
    local_44 = 0;
    while( true ) {
      lVar6 = (long)local_44;
      lVar7 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_10);
      bVar1 = false;
      if (lVar6 < lVar7) {
        in_stack_ffffffffffffff78 =
             (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)(long)local_44;
        lVar6 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_18);
        bVar1 = (long)in_stack_ffffffffffffff78 < lVar6;
      }
      if (!bVar1) break;
      bVar1 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::isValid
                        (in_stack_ffffffffffffff78,
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if ((bVar1) &&
         (bVar1 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::isValid
                            (in_stack_ffffffffffffff78,
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)), bVar1))
      {
        local_48 = 0;
        while( true ) {
          in_stack_ffffffffffffff70 = local_48;
          iVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(local_10);
          in_stack_ffffffffffffff74 = in_stack_ffffffffffffff74 & 0xffffff;
          if (in_stack_ffffffffffffff70 < iVar4) {
            in_stack_ffffffffffffff6c = local_48;
            iVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(local_18);
            in_stack_ffffffffffffff74 =
                 CONCAT13(in_stack_ffffffffffffff6c < iVar4,(int3)in_stack_ffffffffffffff74);
          }
          if ((char)(in_stack_ffffffffffffff74 >> 0x18) == '\0') break;
          sVar2 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::get
                            (local_10,(long)local_44,(long)local_40,local_48);
          sVar3 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::get
                            (local_18,(long)local_44,(long)local_40,local_48);
          if (((int)(uint)sVar2 < *in_RDI * local_1c + local_1c + -1) &&
             ((int)(uint)sVar3 < in_RDI[1] * local_1c + local_1c + -1)) {
            lVar6 = *(long *)(*(long *)(in_RDI + 6) +
                             (long)(int)((long)(ulong)sVar3 / (long)local_1c) * 8);
            lVar7 = (long)(int)((long)(ulong)sVar2 / (long)local_1c);
            *(long *)(lVar6 + lVar7 * 8) = *(long *)(lVar6 + lVar7 * 8) + 1;
          }
          local_48 = local_48 + 1;
        }
      }
      local_44 = local_44 + 1;
    }
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

Histogram(const Image<T> &image1, const Image<T> &image2, int binsize=1)
    {
      w=h=bs=0;
      val=0;
      row=0;

      int width=std::max(256, std::min(65536, static_cast<int>(image1.maxValue())))/binsize;
      int height=std::max(256, std::min(65536, static_cast<int>(image2.maxValue())))/binsize;
      setSize(width, height, binsize);
      clear();

      for (int k=0; k<image1.getHeight() && k < image2.getHeight(); k++)
      {
        for (int i=0; i<image1.getWidth() && i < image2.getWidth(); i++)
        {
          if (image1.isValid(i, k) && image2.isValid(i, k))
          {
            for (int d=0; d<image1.getDepth() && d < image2.getDepth(); d++)
            {
              T v1=image1.get(i, k, d);
              T v2=image2.get(i, k, d);

              if (v1 < w*binsize+binsize-1 && v2 < h*binsize+binsize-1)
              {
                row[static_cast<int>(v2)/binsize][static_cast<int>(v1)/binsize]++;
              }
            }
          }
        }
      }
    }